

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewLogger(PosixEnv *this,string *filename,Logger **result)

{
  long lVar1;
  int __fd;
  char *__file;
  FILE *pFVar2;
  FILE *fp_00;
  undefined8 *in_RCX;
  string *in_RDX;
  char *in_RDI;
  long in_FS_OFFSET;
  FILE *fp;
  int fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  PosixLogger *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __file = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_ffffffffffffff88);
  __fd = open(__file,0x80441,0x1a4);
  if (__fd < 0) {
    *in_RCX = 0;
    __errno_location();
    PosixError(in_RDX,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  else {
    pFVar2 = fdopen(__fd,"w");
    if (pFVar2 == (FILE *)0x0) {
      close(__fd);
      *in_RCX = 0;
      __errno_location();
      PosixError(in_stack_ffffffffffffffa0,(int)((ulong)in_RDX >> 0x20));
    }
    else {
      fp_00 = (FILE *)operator_new(0x10);
      PosixLogger::PosixLogger(in_stack_ffffffffffffff98,fp_00);
      *in_RCX = fp_00;
      Status::OK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status NewLogger(const std::string& filename, Logger** result) override {
    int fd = ::open(filename.c_str(),
                    O_APPEND | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    std::FILE* fp = ::fdopen(fd, "w");
    if (fp == nullptr) {
      ::close(fd);
      *result = nullptr;
      return PosixError(filename, errno);
    } else {
      *result = new PosixLogger(fp);
      return Status::OK();
    }
  }